

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionHelper.cpp
# Opt level: O0

Term * Inferences::InductionHelper::getOtherTermFromComparison(Literal *l,Term *t)

{
  bool bVar1;
  Term *pTVar2;
  Term *in_RSI;
  uint i;
  Literal *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  TermList in_stack_ffffffffffffffd8;
  uint local_1c;
  
  bVar1 = anon_unknown_1::isIntegerComparisonLiteral(in_stack_ffffffffffffffc8);
  if (bVar1) {
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd8 =
           Kernel::Term::termArg
                     (in_stack_ffffffffffffffd8._content,
                      (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      pTVar2 = Kernel::TermList::term((TermList *)0x7f196a);
      if (pTVar2 == in_RSI) {
        Kernel::Term::termArg
                  ((Term *)in_stack_ffffffffffffffd8._content,
                   (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
        pTVar2 = Kernel::TermList::term((TermList *)0x7f1993);
        return pTVar2;
      }
    }
  }
  return (Term *)0x0;
}

Assistant:

Term* InductionHelper::getOtherTermFromComparison(Literal* l, Term* t) {
  if (isIntegerComparisonLiteral(l)) {
    ASS(l->ground());
    ASS_EQ(l->arity(),2);
    for (unsigned i = 0; i < 2; ++i) {
      if (l->termArg(i).term() == t) {
        return l->termArg(1-i).term();
      }
    }
  }
  return nullptr;
}